

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

bool Js::InlinedFrameWalker::FromPhysicalFrame
               (InlinedFrameWalker *self,StackFrame *physicalFrame,ScriptFunction *parent,
               bool fromBailout,int loopNum,JavascriptStackWalker *stackWalker,
               bool useInternalFrameInfo,bool noAlloc)

{
  void *returnAddress;
  void **ppvVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  byte extraout_AL;
  uint uVar5;
  BOOL BVar6;
  FunctionBody *pFVar7;
  undefined4 *puVar8;
  FunctionEntryPointInfo *this;
  void *entry;
  InlinedFrameLayout *outerMostFrame;
  InlineeFrameRecord *this_00;
  HeapAllocator *this_01;
  InlinedFrame **frames;
  InlinedFrameLayout *pIVar9;
  int frameCount;
  StackFrame *pSVar10;
  InternalFrameInfo *pIVar11;
  long lVar12;
  long lVar13;
  size_t byteSize;
  bool bVar14;
  undefined1 local_80 [8];
  TrackAllocData data;
  
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)parent);
  if (stackWalker == (JavascriptStackWalker *)0x0 && loopNum != -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x4ee,"(stackWalker)","stackWalker");
    if (!bVar3) goto LAB_00afbd0a;
    *puVar8 = 0;
  }
  data._32_8_ = self;
  if (useInternalFrameInfo && loopNum != -1) {
    pIVar11 = &stackWalker->lastInternalFrameInfo;
    pSVar10 = (StackFrame *)&(stackWalker->lastInternalFrameInfo).framePointer;
    if ((stackWalker->lastInternalFrameInfo).codeAddress == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x4f5,
                                  "(stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr)"
                                  ,
                                  "stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr"
                                 );
      if (!bVar3) goto LAB_00afbd0a;
      *puVar8 = 0;
    }
  }
  else {
    pIVar11 = (InternalFrameInfo *)&physicalFrame->codeAddr;
    pSVar10 = physicalFrame;
  }
  returnAddress = pIVar11->codeAddress;
  ppvVar1 = pSVar10->frame;
  if (loopNum == -1) {
    this = FunctionBody::GetEntryPointFromNativeAddress(pFVar7,(DWORD_PTR)returnAddress);
  }
  else {
    this = (FunctionEntryPointInfo *)
           FunctionBody::GetLoopEntryPointInfoFromNativeAddress
                     (pFVar7,(DWORD_PTR)returnAddress,loopNum);
  }
  if (this == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x50a,"(entryPointInfo != nullptr)",
                                "Inlined frame should resolve to the right parent address");
    if (!bVar3) goto LAB_00afbd0a;
    *puVar8 = 0;
  }
  bVar3 = EntryPointInfo::HasInlinees(&this->super_EntryPointInfo);
  if (bVar3) {
    entry = (void *)EntryPointInfo::GetNativeAddress(&this->super_EntryPointInfo);
    outerMostFrame =
         &InlinedFrame::FromPhysicalFrame
                    (physicalFrame,stackWalker,entry,&this->super_EntryPointInfo,
                     useInternalFrameInfo)->super_InlinedFrameLayout;
    if (outerMostFrame == (InlinedFrameLayout *)0x0) {
      bVar14 = false;
      bVar3 = false;
      bVar4 = 0;
    }
    else {
      if ((!fromBailout) &&
         (this_00 = EntryPointInfo::FindInlineeFrame(&this->super_EntryPointInfo,returnAddress),
         this_00 != (InlineeFrameRecord *)0x0)) {
        pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)parent);
        InlineeFrameRecord::RestoreFrames
                  (this_00,pFVar7,outerMostFrame,(JavascriptCallStackLayout *)(ppvVar1 + 2),false);
      }
      bVar14 = ((ulong)outerMostFrame->callInfo & 0xf) == 0;
      bVar3 = !bVar14;
      bVar4 = 1;
      if (!noAlloc && !bVar14) {
        uVar5 = *(uint *)&outerMostFrame->callInfo & 0xf;
        if (uVar5 == 0) {
          frameCount = 0;
        }
        else {
          frameCount = 0;
          pIVar9 = outerMostFrame;
          do {
            frameCount = frameCount + 1;
            pIVar9 = (InlinedFrameLayout *)(&pIVar9[1].callInfo + uVar5);
            uVar5 = *(uint *)&pIVar9->callInfo & 0xf;
          } while (uVar5 != 0);
        }
        local_80 = (undefined1  [8])&InlinedFrame*::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_4f74616;
        data.filename._0_4_ = 0x52e;
        data.plusSize = (long)frameCount;
        this_01 = Memory::HeapAllocator::TrackAllocInfo
                            (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_80);
        byteSize = 0xffffffffffffffff;
        if (-1 < frameCount) {
          byteSize = (long)frameCount * 8;
        }
        BVar6 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                       "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar14) goto LAB_00afbd0a;
          *puVar8 = 0;
        }
        frames = (InlinedFrame **)Memory::HeapAllocator::AllocT<false>(this_01,byteSize);
        if (frames == (InlinedFrame **)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar14) {
LAB_00afbd0a:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
        if (-1 < (int)(frameCount - 1U)) {
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          lVar12 = (ulong)(frameCount - 1U) + 1;
          do {
            if (outerMostFrame == (InlinedFrameLayout *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar8 = 1;
              bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                           ,0x533,"(frameIterator)","frameIterator");
              if (!bVar14) goto LAB_00afbd0a;
              *puVar8 = 0;
            }
            frames[lVar12 + -1] = (InlinedFrame *)outerMostFrame;
            outerMostFrame =
                 (InlinedFrameLayout *)
                 (&outerMostFrame[1].callInfo + (*(uint *)&outerMostFrame->callInfo & 0xf));
            lVar13 = lVar12 + -1;
            bVar14 = 0 < lVar12;
            lVar12 = lVar13;
          } while (lVar13 != 0 && bVar14);
        }
        Initialize((InlinedFrameWalker *)data._32_8_,frameCount,frames,parent);
        bVar14 = true;
        bVar4 = extraout_AL;
      }
    }
    if (bVar14) {
      bVar4 = bVar3;
    }
  }
  else {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool InlinedFrameWalker::FromPhysicalFrame(InlinedFrameWalker& self, StackFrame& physicalFrame, Js::ScriptFunction *parent, bool fromBailout,
        int loopNum, const JavascriptStackWalker * const stackWalker, bool useInternalFrameInfo, bool noAlloc)
    {
        bool inlinedFramesFound = false;
        FunctionBody* parentFunctionBody = parent->GetFunctionBody();
        EntryPointInfo *entryPointInfo;

        if (loopNum != -1)
        {
            Assert(stackWalker);
        }

        void *nativeCodeAddress = nullptr;
        void *framePointer = nullptr;
        if (loopNum != -1 && useInternalFrameInfo)
        {
            Assert(stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr);
            InternalFrameInfo lastInternalFrameInfo = stackWalker->GetCachedInternalFrameInfo();

            nativeCodeAddress = lastInternalFrameInfo.codeAddress;
            framePointer = lastInternalFrameInfo.framePointer;
        }
        else
        {
            nativeCodeAddress = physicalFrame.GetInstructionPointer();
            framePointer = physicalFrame.GetFrame();
        }

        if (loopNum != -1)
        {
            entryPointInfo = (Js::EntryPointInfo*)parentFunctionBody->GetLoopEntryPointInfoFromNativeAddress((DWORD_PTR)nativeCodeAddress, loopNum);
        }
        else
        {
            entryPointInfo = (Js::EntryPointInfo*)parentFunctionBody->GetEntryPointFromNativeAddress((DWORD_PTR)nativeCodeAddress);
        }

        AssertMsg(entryPointInfo != nullptr, "Inlined frame should resolve to the right parent address");
        if (entryPointInfo->HasInlinees())
        {
            void *entry = reinterpret_cast<void*>(entryPointInfo->GetNativeAddress());
            InlinedFrameWalker::InlinedFrame *outerMostFrame = InlinedFrame::FromPhysicalFrame(physicalFrame, stackWalker, entry, entryPointInfo, useInternalFrameInfo);

            if (!outerMostFrame)
            {
                return inlinedFramesFound;
            }

            if (!fromBailout)
            {
                InlineeFrameRecord* record = entryPointInfo->FindInlineeFrame((void*)nativeCodeAddress);

                if (record)
                {
                    record->RestoreFrames(parent->GetFunctionBody(), outerMostFrame, JavascriptCallStackLayout::FromFramePointer(framePointer), false /* boxValues */);
                }
            }

            if (outerMostFrame->callInfo.Count)
            {
                inlinedFramesFound = true;
                if (noAlloc)
                {
                    return inlinedFramesFound;
                }
                int32 frameCount = 0;
                InlinedFrameWalker::InlinedFrame *frameIterator = outerMostFrame;
                while (frameIterator->callInfo.Count)
                {
                    frameCount++;
                    frameIterator = frameIterator->Next();
                }

                InlinedFrameWalker::InlinedFrame **frames = HeapNewArray(InlinedFrameWalker::InlinedFrame*, frameCount);

                frameIterator = outerMostFrame;
                for (int index = frameCount - 1; index >= 0; index--)
                {
                    Assert(frameIterator);
                    frames[index] = frameIterator;
                    frameIterator = frameIterator->Next();
                }

                self.Initialize(frameCount, frames, parent);
            }

        }

        return inlinedFramesFound;
    }